

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O3

bool __thiscall zmq::stream_engine_base_t::restart_input(stream_engine_base_t *this)

{
  size_t sVar1;
  bool bVar2;
  int iVar3;
  ulong in_RAX;
  int *piVar4;
  ulong uVar5;
  uchar *puVar6;
  code *pcVar7;
  size_t processed;
  ulong local_38;
  
  local_38 = in_RAX;
  if (this->_input_stopped == false) {
    restart_input();
  }
  if (this->_session == (session_base_t *)0x0) {
    restart_input();
  }
  if (this->_decoder == (i_decoder *)0x0) {
    restart_input();
  }
  pcVar7 = (code *)this->_process_msg;
  puVar6 = (this->_options).routing_id + *(long *)&this->field_0x560 + -0x29;
  if (((ulong)pcVar7 & 1) != 0) {
    pcVar7 = *(code **)(pcVar7 + *(long *)puVar6 + -1);
  }
  iVar3 = (*this->_decoder->_vptr_i_decoder[5])();
  iVar3 = (*pcVar7)(puVar6,iVar3);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0xb) {
LAB_0019b2b1:
      (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,0);
      return false;
    }
LAB_0019b31a:
    session_base_t::flush(this->_session);
LAB_0019b326:
    bVar2 = true;
  }
  else {
    sVar1 = this->_insize;
    while (sVar1 != 0) {
      local_38 = 0;
      iVar3 = (*this->_decoder->_vptr_i_decoder[4])(this->_decoder,this->_inpos,sVar1,&local_38);
      uVar5 = this->_insize;
      if (uVar5 < local_38) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","processed <= _insize",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/stream_engine_base.cpp"
                ,0x1b3);
        fflush(_stderr);
        zmq_abort("processed <= _insize");
        uVar5 = this->_insize;
      }
      this->_inpos = this->_inpos + local_38;
      this->_insize = uVar5 - local_38;
      if (iVar3 + 1U < 2) {
        if (iVar3 == -1) {
LAB_0019b310:
          piVar4 = __errno_location();
          if (*piVar4 == 0xb) goto LAB_0019b31a;
          if (this->_io_error == true) goto LAB_0019b2ce;
          goto LAB_0019b2b1;
        }
        break;
      }
      pcVar7 = (code *)this->_process_msg;
      puVar6 = (this->_options).routing_id + *(long *)&this->field_0x560 + -0x29;
      if (((ulong)pcVar7 & 1) != 0) {
        pcVar7 = *(code **)(pcVar7 + *(long *)puVar6 + -1);
      }
      iVar3 = (*this->_decoder->_vptr_i_decoder[5])();
      iVar3 = (*pcVar7)(puVar6,iVar3);
      if (iVar3 == -1) goto LAB_0019b310;
      sVar1 = this->_insize;
    }
    if (this->_io_error == false) {
      this->_input_stopped = false;
      io_object_t::set_pollin(&this->super_io_object_t,this->_handle);
      session_base_t::flush(this->_session);
      bVar2 = in_event_internal(this);
      if (bVar2) goto LAB_0019b326;
    }
    else {
LAB_0019b2ce:
      (*(this->super_io_object_t).super_i_poll_events._vptr_i_poll_events[0xc])(this,1);
    }
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool zmq::stream_engine_base_t::restart_input ()
{
    zmq_assert (_input_stopped);
    zmq_assert (_session != NULL);
    zmq_assert (_decoder != NULL);

    int rc = (this->*_process_msg) (_decoder->msg ());
    if (rc == -1) {
        if (errno == EAGAIN)
            _session->flush ();
        else {
            error (protocol_error);
            return false;
        }
        return true;
    }

    while (_insize > 0) {
        size_t processed = 0;
        rc = _decoder->decode (_inpos, _insize, processed);
        zmq_assert (processed <= _insize);
        _inpos += processed;
        _insize -= processed;
        if (rc == 0 || rc == -1)
            break;
        rc = (this->*_process_msg) (_decoder->msg ());
        if (rc == -1)
            break;
    }

    if (rc == -1 && errno == EAGAIN)
        _session->flush ();
    else if (_io_error) {
        error (connection_error);
        return false;
    } else if (rc == -1) {
        error (protocol_error);
        return false;
    }

    else {
        _input_stopped = false;
        set_pollin ();
        _session->flush ();

        //  Speculative read.
        if (!in_event_internal ())
            return false;
    }

    return true;
}